

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyResyn.c
# Opt level: O1

Ivy_Man_t * Ivy_ManRwsat(Ivy_Man_t *pMan,int fVerbose)

{
  int iVar1;
  Ivy_Man_t *p;
  long lVar2;
  long lVar3;
  int iVar4;
  timespec ts;
  timespec local_30;
  
  if (fVerbose != 0) {
    puts("Original:");
    Ivy_ManPrintStats(pMan);
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  Ivy_ManRewritePre(pMan,0,0,0);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Rewrite");
    iVar4 = 3;
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
    Ivy_ManPrintStats(pMan);
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  p = Ivy_ManBalance(pMan,0);
  Ivy_ManStop(pMan);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Balance");
    iVar4 = 3;
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
    Ivy_ManPrintStats(p);
  }
  return p;
}

Assistant:

Ivy_Man_t * Ivy_ManRwsat( Ivy_Man_t * pMan, int fVerbose )
{
    abctime clk;
    Ivy_Man_t * pTemp;

if ( fVerbose ) { printf( "Original:\n" ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, 0, 0, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, 0 );
//    pMan = Ivy_ManDup( pTemp = pMan );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

/*
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, 0, 0, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, 0 );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );
*/
    return pMan;
}